

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enoent.cpp
# Opt level: O2

int main(void)

{
  int __oflag;
  embedded_filesystem fs;
  system_error e;
  allocator<char> local_20 [16];
  
  fs = cmrc::enoent::get_filesystem();
  std::__cxx11::string::string<std::allocator<char>>((string *)&e,"hello.txt",local_20);
  cmrc::embedded_filesystem::open(&fs,(char *)&e,__oflag);
  std::__cxx11::string::~string((string *)&e);
  return 0;
}

Assistant:

int main() {
    auto fs = cmrc::enoent::get_filesystem();
    try {
        auto data = fs.open("hello.txt");
    } catch (std::system_error e) {
        if (e.code() == std::errc::no_such_file_or_directory) {
            return 1;
        }
    }
    return 0;
}